

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O3

Label * labelling::getNextLabel
                  (Label *__return_storage_ptr__,
                  vector<labelling::Label,_std::allocator<labelling::Label>_> *labels_ptr,
                  Directions *direction)

{
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  __first;
  pointer pLVar1;
  Vertex VVar2;
  double dVar3;
  Label *this;
  _Iter_comp_iter<std::greater<void>_> __cmp;
  _Iter_less_iter __comp;
  _Iter_comp_iter<std::greater<void>_> local_2a;
  _Iter_less_iter local_29;
  
  __first._M_current =
       (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl
       .super__Vector_impl_data._M_start;
  pLVar1 = (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (*direction == FWD) {
    if (0x80 < (long)pLVar1 - (long)__first._M_current) {
      std::
      __pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (__first,pLVar1 + -1,pLVar1 + -1,&local_2a);
    }
  }
  else if (0x80 < (long)pLVar1 - (long)__first._M_current) {
    std::
    __pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,pLVar1 + -1,pLVar1 + -1,&local_29);
  }
  pLVar1 = (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  VVar2 = pLVar1[-1].vertex;
  __return_storage_ptr__->weight = pLVar1[-1].weight;
  __return_storage_ptr__->vertex = VVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->resource_consumption,&pLVar1[-1].resource_consumption);
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->partial_path,&pLVar1[-1].partial_path);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&(__return_storage_ptr__->unreachable_nodes)._M_t,&pLVar1[-1].unreachable_nodes._M_t);
  dVar3 = pLVar1[-1].phi;
  __return_storage_ptr__->params_ptr = pLVar1[-1].params_ptr;
  __return_storage_ptr__->phi = dVar3;
  this = (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
         _M_impl.super__Vector_impl_data._M_finish + -1;
  (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl.
  super__Vector_impl_data._M_finish = this;
  Label::~Label(this);
  return __return_storage_ptr__;
}

Assistant:

Label getNextLabel(
    std::vector<Label>*              labels_ptr,
    const bidirectional::Directions& direction) {
  if (direction == bidirectional::FWD)
    std::pop_heap(labels_ptr->begin(), labels_ptr->end(), std::greater<>{});
  else
    std::pop_heap(labels_ptr->begin(), labels_ptr->end());

  // Get next label as the back of the heap
  Label next_label = labels_ptr->back();
  labels_ptr->pop_back();
  return next_label;
}